

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O1

void __thiscall duckdb::GlobalSortState::PrepareMergePhase(GlobalSortState *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer pSVar3;
  idx_t iVar4;
  pointer pRVar5;
  pointer pSVar6;
  ulong uVar7;
  ulong uVar8;
  pointer puVar9;
  idx_t iVar10;
  iterator __begin2;
  pointer puVar11;
  long lVar12;
  iterator __end2;
  
  puVar1 = (this->sorted_blocks).
           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar12 = 0;
  for (puVar11 = (this->sorted_blocks).
                 super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar1; puVar11 = puVar11 + 1
      ) {
    pSVar3 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
             operator->(puVar11);
    iVar4 = SortedBlock::HeapSize(pSVar3);
    lVar12 = lVar12 + iVar4;
  }
  if ((this->external != false) ||
     (((this->pinned_blocks).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (this->pinned_blocks).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_finish &&
      (iVar4 = BufferManager::GetQueryMaxMemory(this->buffer_manager),
      iVar4 <= (ulong)(lVar12 * 4) && lVar12 * 4 - iVar4 != 0)))) {
    this->external = true;
  }
  puVar11 = (this->sorted_blocks).
            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->sorted_blocks).
           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((lVar12 == 0) || (this->external == false)) {
    for (; puVar11 != puVar1; puVar11 = puVar11 + 1) {
      uVar8 = this->block_capacity;
      pSVar3 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
               operator->(puVar11);
      puVar2 = (pSVar3->radix_sorting_data).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar7 = 0;
      for (puVar9 = (pSVar3->radix_sorting_data).
                    super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar2; puVar9 = puVar9 + 1
          ) {
        pRVar5 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator->(puVar9);
        uVar7 = uVar7 + pRVar5->count;
      }
      if (uVar7 < uVar8) {
        uVar7 = uVar8;
      }
      this->block_capacity = uVar7;
    }
  }
  else if (puVar11 != puVar1) {
    uVar8 = 0;
    do {
      pSVar3 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
               operator->(puVar11);
      iVar4 = SortedBlock::SizeInBytes(pSVar3);
      if (uVar8 < iVar4) {
        pSVar3 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
                 operator->(puVar11);
        puVar2 = (pSVar3->radix_sorting_data).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        iVar10 = 0;
        for (puVar9 = (pSVar3->radix_sorting_data).
                      super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar2;
            puVar9 = puVar9 + 1) {
          pRVar5 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(puVar9);
          iVar10 = iVar10 + pRVar5->count;
        }
        this->block_capacity = iVar10;
        uVar8 = iVar4;
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar1);
  }
  if (this->external == false) {
    puVar1 = (this->sorted_blocks).
             super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar11 = (this->sorted_blocks).
                   super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar1;
        puVar11 = puVar11 + 1) {
      pSVar3 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
               operator->(puVar11);
      pSVar6 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
               operator->(&pSVar3->blob_sorting_data);
      SortedData::Unswizzle(pSVar6);
      pSVar3 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
               operator->(puVar11);
      pSVar6 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
               operator->(&pSVar3->payload_data);
      SortedData::Unswizzle(pSVar6);
    }
  }
  return;
}

Assistant:

void GlobalSortState::PrepareMergePhase() {
	// Determine if we need to use do an external sort
	idx_t total_heap_size =
	    std::accumulate(sorted_blocks.begin(), sorted_blocks.end(), (idx_t)0,
	                    [](idx_t a, const unique_ptr<SortedBlock> &b) { return a + b->HeapSize(); });
	if (external || (pinned_blocks.empty() && total_heap_size * 4 > buffer_manager.GetQueryMaxMemory())) {
		external = true;
	}
	// Use the data that we have to determine which partition size to use during the merge
	if (external && total_heap_size > 0) {
		// If we have variable size data we need to be conservative, as there might be skew
		idx_t max_block_size = 0;
		for (auto &sb : sorted_blocks) {
			idx_t size_in_bytes = sb->SizeInBytes();
			if (size_in_bytes > max_block_size) {
				max_block_size = size_in_bytes;
				block_capacity = sb->Count();
			}
		}
	} else {
		for (auto &sb : sorted_blocks) {
			block_capacity = MaxValue(block_capacity, sb->Count());
		}
	}
	// Unswizzle and pin heap blocks if we can fit everything in memory
	if (!external) {
		for (auto &sb : sorted_blocks) {
			sb->blob_sorting_data->Unswizzle();
			sb->payload_data->Unswizzle();
		}
	}
}